

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_SetPointerPluginTest_doublePointer_TestShell::
~TEST_SetPointerPluginTest_doublePointer_TestShell
          (TEST_SetPointerPluginTest_doublePointer_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SetPointerPluginTest, doublePointer)
{
    SetDoublePointerUtestShell *doubletst = new SetDoublePointerUtestShell();
    myRegistry_->addTest(doubletst);
    myRegistry_->runAllTests(*result_);

    CHECK(orig_double_ptr == &orig_double);
    LONGS_EQUAL(1, result_->getCheckCount());
    delete doubletst;
}